

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderCustomData.cpp
# Opt level: O3

bool Assimp::Blender::read<Assimp::Blender::MTFace>
               (Structure *s,MTFace *p,size_t cnt,FileDatabase *db)

{
  float (*pafVar1) [2];
  MTFace read;
  MTFace local_68;
  
  if (cnt != 0) {
    pafVar1 = p->uv;
    do {
      local_68.super_ElemBase.dna_type = (char *)0x0;
      local_68.super_ElemBase._vptr_ElemBase = (_func_int **)&PTR__ElemBase_007e0d18;
      local_68.flag = '\0';
      local_68.mode = 0;
      local_68.tile = 0;
      local_68.unwrap = 0;
      Structure::Convert<Assimp::Blender::MTFace>(s,&local_68,db);
      pafVar1[-1] = (float  [2])local_68.super_ElemBase.dna_type;
      *pafVar1 = local_68.uv[0];
      pafVar1[1] = local_68.uv[1];
      pafVar1[2] = local_68.uv[2];
      pafVar1[3] = local_68.uv[3];
      pafVar1[4] = (float  [2])
                   CONCAT26(local_68.unwrap,
                            CONCAT42(local_68._50_4_,CONCAT11(local_68._49_1_,local_68.flag)));
      pafVar1 = pafVar1 + 7;
      cnt = cnt - 1;
    } while (cnt != 0);
  }
  return true;
}

Assistant:

bool read(const Structure &s, T *p, const size_t cnt, const FileDatabase &db) {
            for (size_t i = 0; i < cnt; ++i) {
                T read;
                s.Convert(read, db);
                *p = read;
                p++;
            }
            return true;
        }